

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_filter.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::DynamicFilter::ToExpression(DynamicFilter *this,Expression *column)

{
  DynamicFilterData *pDVar1;
  pthread_mutex_t *__mutex;
  pointer pCVar2;
  string *this_00;
  _func_int **local_68;
  Value local_60;
  
  if ((column->super_BaseExpression).alias._M_dataplus._M_p != (pointer)0x0) {
    this_00 = &(column->super_BaseExpression).alias;
    pDVar1 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->
                       ((shared_ptr<duckdb::DynamicFilterData,_true> *)this_00);
    if (pDVar1->initialized != false) {
      __mutex = (pthread_mutex_t *)
                shared_ptr<duckdb::DynamicFilterData,_true>::operator->
                          ((shared_ptr<duckdb::DynamicFilterData,_true> *)this_00);
      ::std::mutex::lock((mutex *)&__mutex->__data);
      pDVar1 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->
                         ((shared_ptr<duckdb::DynamicFilterData,_true> *)this_00);
      pCVar2 = unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>
               ::operator->(&pDVar1->filter);
      (*(pCVar2->super_TableFilter)._vptr_TableFilter[6])(this,pCVar2);
      pthread_mutex_unlock(__mutex);
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
    }
  }
  Value::Value(&local_60,true);
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_68,&local_60);
  Value::~Value(&local_60);
  (this->super_TableFilter)._vptr_TableFilter = local_68;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> DynamicFilter::ToExpression(const Expression &column) const {
	if (!filter_data || !filter_data->initialized) {
		auto bound_constant = make_uniq<BoundConstantExpression>(Value(true));
		return std::move(bound_constant);
	}
	lock_guard<mutex> l(filter_data->lock);
	return filter_data->filter->ToExpression(column);
}